

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_contains.cpp
# Opt level: O1

void duckdb::MapContainsFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  idx_t target_count;
  reference vector;
  Vector *source_v;
  reference target_v;
  
  target_count = input->count;
  vector = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  source_v = MapVector::GetKeys(vector);
  target_v = vector<duckdb::Vector,_true>::operator[](&input->data,1);
  ListSearchOp<false>(vector,source_v,target_v,result,target_count);
  if (target_count == 1) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    return;
  }
  return;
}

Assistant:

static void MapContainsFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	const auto count = input.size();

	auto &map_vec = input.data[0];
	auto &key_vec = MapVector::GetKeys(map_vec);
	auto &arg_vec = input.data[1];

	ListSearchOp<false>(map_vec, key_vec, arg_vec, result, count);

	if (count == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}